

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CGL::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  XMLElement *xml_00;
  XMLElement *xml_01;
  CameraInfo *this;
  LightInfo *this_00;
  PolymeshInfo *polymesh;
  MaterialInfo *pMVar6;
  int iVar7;
  int i;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  Matrix4x4 mat;
  string sid;
  string name;
  string s;
  double local_448;
  double dStack_440;
  double dStack_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double dStack_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double dStack_3f8;
  double dStack_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string s_1;
  Node node;
  Matrix4x4 transform_save;
  
  Node::Node(&node);
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&node);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&node.name);
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  do {
    if (pXVar4 == (XMLElement *)0x0) break;
    pcVar5 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
    std::__cxx11::string::string((string *)&name,pcVar5,(allocator *)&transform_save);
    bVar2 = std::operator==(&name,"matrix");
    if (bVar2) {
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&s,pcVar5,(allocator *)&transform_save);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&transform_save,(string *)&s,_S_out|_S_in);
      mat.entries[2].field_0 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40)
      ;
      mat.entries[0].field_0 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40)
      ;
      mat.entries[1].field_0 = mat.entries[0].field_0;
      mat.entries[3].field_0 = mat.entries[2].field_0;
      Matrix4x4::operator()(&mat,0,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,0,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,1,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,2,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,0);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,1);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,2);
      std::istream::_M_extract<double>((double *)&transform_save);
      Matrix4x4::operator()(&mat,3,3);
      std::istream::_M_extract<double>((double *)&transform_save);
      node.transform.entries[3].field_0.field_0.x = mat.entries[3].field_0.field_0.x;
      node.transform.entries[3].field_0.field_0.y = mat.entries[3].field_0.field_0.y;
      node.transform.entries[3].field_0.field_0.z = mat.entries[3].field_0.field_0.z;
      node.transform.entries[3].field_0.field_0.w = mat.entries[3].field_0.field_0.w;
      node.transform.entries[2].field_0.field_0.x = mat.entries[2].field_0.field_0.x;
      node.transform.entries[2].field_0.field_0.y = mat.entries[2].field_0.field_0.y;
      node.transform.entries[2].field_0.field_0.z = mat.entries[2].field_0.field_0.z;
      node.transform.entries[2].field_0.field_0.w = mat.entries[2].field_0.field_0.w;
      node.transform.entries[1].field_0.field_0.x = mat.entries[1].field_0.field_0.x;
      node.transform.entries[1].field_0.field_0.y = mat.entries[1].field_0.field_0.y;
      node.transform.entries[1].field_0.field_0.z = mat.entries[1].field_0.field_0.z;
      node.transform.entries[1].field_0.field_0.w = mat.entries[1].field_0.field_0.w;
      node.transform.entries[0].field_0.field_0.x = mat.entries[0].field_0.field_0.x;
      node.transform.entries[0].field_0.field_0.y = mat.entries[0].field_0.field_0.y;
      node.transform.entries[0].field_0.field_0.z = mat.entries[0].field_0.field_0.z;
      node.transform.entries[0].field_0.field_0.w = mat.entries[0].field_0.field_0.w;
      std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      bVar3 = std::operator==(&name,"rotate");
      if (bVar3) {
        mat.entries[2].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[0].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[1].field_0 = mat.entries[0].field_0;
        mat.entries[3].field_0 = mat.entries[2].field_0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"sid",(char *)0x0);
        std::__cxx11::string::string((string *)&sid,pcVar5,(allocator *)&s);
        cVar1 = sid._M_dataplus._M_p[sid._M_string_length - 1];
        if (cVar1 == 'X') {
          Matrix4x4::operator()(&mat,1,1);
          std::istream::_M_extract<double>((double *)&transform_save);
          Matrix4x4::operator()(&mat,1,2);
          std::istream::_M_extract<double>((double *)&transform_save);
          i = 2;
          iVar7 = 1;
LAB_001123c2:
          Matrix4x4::operator()(&mat,i,iVar7);
          std::istream::_M_extract<double>((double *)&transform_save);
          iVar7 = 2;
LAB_001123da:
          Matrix4x4::operator()(&mat,iVar7,iVar7);
          std::istream::_M_extract<double>((double *)&transform_save);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()(&mat,0,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,2,0);
            i = 0;
            std::istream::_M_extract<double>((double *)&transform_save);
            iVar7 = 2;
            goto LAB_001123c2;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()(&mat,0,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,0,1);
            std::istream::_M_extract<double>((double *)&transform_save);
            Matrix4x4::operator()(&mat,1,0);
            std::istream::_M_extract<double>((double *)&transform_save);
            iVar7 = 1;
            goto LAB_001123da;
          }
        }
        Matrix4x4::operator*(&mat,&node.transform);
        node.transform.entries[3].field_0.field_0.x = local_408;
        node.transform.entries[3].field_0.field_0.y = dStack_400;
        node.transform.entries[3].field_0.field_0.z = dStack_3f8;
        node.transform.entries[3].field_0.field_0.w = dStack_3f0;
        node.transform.entries[2].field_0.field_0.x = local_428;
        node.transform.entries[2].field_0.field_0.y = dStack_420;
        node.transform.entries[2].field_0.field_0.z = dStack_418;
        node.transform.entries[2].field_0.field_0.w = dStack_410;
        node.transform.entries[1].field_0.field_0.x = local_448;
        node.transform.entries[1].field_0.field_0.y = dStack_440;
        node.transform.entries[1].field_0.field_0.z = dStack_438;
        node.transform.entries[1].field_0.field_0.w = dStack_430;
        node.transform.entries[0].field_0.field_0.x = (double)s._M_dataplus._M_p;
        node.transform.entries[0].field_0.field_0.y = (double)s._M_string_length;
        node.transform.entries[0].field_0.field_0.z = (double)s.field_2._M_allocated_capacity;
        node.transform.entries[0].field_0.field_0.w = (double)s.field_2._8_8_;
        std::__cxx11::string::~string((string *)&sid);
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      bVar3 = std::operator==(&name,"translate");
      if (bVar3) {
        mat.entries[2].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[0].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[1].field_0 = mat.entries[0].field_0;
        mat.entries[3].field_0 = mat.entries[2].field_0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        Matrix4x4::operator()(&mat,0,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,2,3);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator*(&mat,&node.transform);
        node.transform.entries[3].field_0.field_0.x = local_408;
        node.transform.entries[3].field_0.field_0.y = dStack_400;
        node.transform.entries[3].field_0.field_0.z = dStack_3f8;
        node.transform.entries[3].field_0.field_0.w = dStack_3f0;
        node.transform.entries[2].field_0.field_0.x = local_428;
        node.transform.entries[2].field_0.field_0.y = dStack_420;
        node.transform.entries[2].field_0.field_0.z = dStack_418;
        node.transform.entries[2].field_0.field_0.w = dStack_410;
        node.transform.entries[1].field_0.field_0.x = local_448;
        node.transform.entries[1].field_0.field_0.y = dStack_440;
        node.transform.entries[1].field_0.field_0.z = dStack_438;
        node.transform.entries[1].field_0.field_0.w = dStack_430;
        node.transform.entries[0].field_0.field_0.x = (double)s._M_dataplus._M_p;
        node.transform.entries[0].field_0.field_0.y = (double)s._M_string_length;
        node.transform.entries[0].field_0.field_0.z = (double)s.field_2._M_allocated_capacity;
        node.transform.entries[0].field_0.field_0.w = (double)s.field_2._8_8_;
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      bVar3 = std::operator==(&name,"scale");
      if (bVar3) {
        mat.entries[2].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[0].field_0 =
             (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        mat.entries[1].field_0 = mat.entries[0].field_0;
        mat.entries[3].field_0 = mat.entries[2].field_0;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&s_1,pcVar5,(allocator *)&transform_save);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&transform_save,(string *)&s_1,_S_out|_S_in);
        Matrix4x4::operator()(&mat,0,0);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,1);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator()(&mat,1,1);
        std::istream::_M_extract<double>((double *)&transform_save);
        Matrix4x4::operator*(&mat,&node.transform);
        node.transform.entries[3].field_0.field_0.x = local_408;
        node.transform.entries[3].field_0.field_0.y = dStack_400;
        node.transform.entries[3].field_0.field_0.z = dStack_3f8;
        node.transform.entries[3].field_0.field_0.w = dStack_3f0;
        node.transform.entries[2].field_0.field_0.x = local_428;
        node.transform.entries[2].field_0.field_0.y = dStack_420;
        node.transform.entries[2].field_0.field_0.z = dStack_418;
        node.transform.entries[2].field_0.field_0.w = dStack_410;
        node.transform.entries[1].field_0.field_0.x = local_448;
        node.transform.entries[1].field_0.field_0.y = dStack_440;
        node.transform.entries[1].field_0.field_0.z = dStack_438;
        node.transform.entries[1].field_0.field_0.w = dStack_430;
        node.transform.entries[0].field_0.field_0.x = (double)s._M_dataplus._M_p;
        node.transform.entries[0].field_0.field_0.y = (double)s._M_string_length;
        node.transform.entries[0].field_0.field_0.z = (double)s.field_2._M_allocated_capacity;
        node.transform.entries[0].field_0.field_0.w = (double)s.field_2._8_8_;
        std::__cxx11::stringstream::~stringstream((stringstream *)&transform_save);
        std::__cxx11::string::~string((string *)&s_1);
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&name);
  } while (!bVar2);
  Matrix4x4::Matrix4x4(&transform_save,(Matrix4x4 *)transform);
  Matrix4x4::operator*((Matrix4x4 *)transform,&node.transform);
  node.transform.entries[3].field_0.field_0.x = mat.entries[3].field_0.field_0.x;
  node.transform.entries[3].field_0.field_0.y = mat.entries[3].field_0.field_0.y;
  node.transform.entries[3].field_0.field_0.z = mat.entries[3].field_0.field_0.z;
  node.transform.entries[3].field_0.field_0.w = mat.entries[3].field_0.field_0.w;
  node.transform.entries[2].field_0.field_0.x = mat.entries[2].field_0.field_0.x;
  node.transform.entries[2].field_0.field_0.y = mat.entries[2].field_0.field_0.y;
  node.transform.entries[2].field_0.field_0.z = mat.entries[2].field_0.field_0.z;
  node.transform.entries[2].field_0.field_0.w = mat.entries[2].field_0.field_0.w;
  node.transform.entries[1].field_0.field_0.x = mat.entries[1].field_0.field_0.x;
  node.transform.entries[1].field_0.field_0.y = mat.entries[1].field_0.field_0.y;
  node.transform.entries[1].field_0.field_0.z = mat.entries[1].field_0.field_0.z;
  node.transform.entries[1].field_0.field_0.w = mat.entries[1].field_0.field_0.w;
  node.transform.entries[0].field_0.field_0.x = mat.entries[0].field_0.field_0.x;
  node.transform.entries[0].field_0.field_0.y = mat.entries[0].field_0.field_0.y;
  node.transform.entries[0].field_0.field_0.z = mat.entries[0].field_0.field_0.z;
  node.transform.entries[0].field_0.field_0.w = mat.entries[0].field_0.field_0.w;
  transform._0_8_ = mat.entries[0].field_0.field_0.x;
  transform._8_8_ = mat.entries[0].field_0.field_0.y;
  transform._16_8_ = mat.entries[0].field_0.field_0.z;
  transform._24_8_ = mat.entries[0].field_0.field_0.w;
  transform._32_8_ = mat.entries[1].field_0.field_0.x;
  transform._40_8_ = mat.entries[1].field_0.field_0.y;
  transform._48_8_ = mat.entries[1].field_0.field_0.z;
  transform._56_8_ = mat.entries[1].field_0.field_0.w;
  transform._64_8_ = mat.entries[2].field_0.field_0.x;
  transform._72_8_ = mat.entries[2].field_0.field_0.y;
  transform._80_8_ = mat.entries[2].field_0.field_0.z;
  transform._88_8_ = mat.entries[2].field_0.field_0.w;
  transform._96_8_ = mat.entries[3].field_0.field_0.x;
  transform._104_8_ = mat.entries[3].field_0.field_0.y;
  transform._112_8_ = mat.entries[3].field_0.field_0.z;
  transform._120_8_ = mat.entries[3].field_0.field_0.w;
  std::__cxx11::string::string((string *)&local_2c8,"node",(allocator *)&mat);
  pXVar4 = get_element(xml,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  for (; pXVar4 != (XMLElement *)0x0;
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
    parse_node(pXVar4);
  }
  transform._96_8_ = transform_save.entries[3].field_0.field_0.x;
  transform._104_8_ = transform_save.entries[3].field_0.field_0.y;
  transform._112_8_ = transform_save.entries[3].field_0.field_0.z;
  transform._120_8_ = transform_save.entries[3].field_0.field_0.w;
  transform._64_8_ = transform_save.entries[2].field_0.field_0.x;
  transform._72_8_ = transform_save.entries[2].field_0.field_0.y;
  transform._80_8_ = transform_save.entries[2].field_0.field_0.z;
  transform._88_8_ = transform_save.entries[2].field_0.field_0.w;
  transform._32_8_ = transform_save.entries[1].field_0.field_0.x;
  transform._40_8_ = transform_save.entries[1].field_0.field_0.y;
  transform._48_8_ = transform_save.entries[1].field_0.field_0.z;
  transform._56_8_ = transform_save.entries[1].field_0.field_0.w;
  transform._0_8_ = transform_save.entries[0].field_0.field_0.x;
  transform._8_8_ = transform_save.entries[0].field_0.field_0.y;
  transform._16_8_ = transform_save.entries[0].field_0.field_0.z;
  transform._24_8_ = transform_save.entries[0].field_0.field_0.w;
  std::__cxx11::string::string((string *)&local_2e8,"instance_camera",(allocator *)&mat);
  pXVar4 = get_element(xml,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_308,"instance_light",(allocator *)&mat);
  xml_00 = get_element(xml,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_328,"instance_geometry",(allocator *)&mat);
  xml_01 = get_element(xml,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  if (pXVar4 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        std::__cxx11::string::string((string *)&local_348,"mesh",(allocator *)&mat);
        pXVar4 = get_element(xml_01,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        if (pXVar4 == (XMLElement *)0x0) {
          std::__cxx11::string::string((string *)&local_3a8,"extra",(allocator *)&mat);
          pXVar4 = get_element(xml_01,&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001128e0;
          polymesh = (PolymeshInfo *)operator_new(0x58);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&polymesh->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(polymesh->super_Instance).id.field_2 + 8) =
               ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(polymesh->super_Instance).name.field_2 = ZEXT1632(auVar8);
          (polymesh->super_Instance).id._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).id.field_2;
          (polymesh->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (polymesh->super_Instance).name._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).name.field_2;
          (polymesh->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)polymesh);
          std::__cxx11::string::string
                    ((string *)&local_3c8,
                     "instance_geometry/bind_material/technique_common/instance_material",
                     (allocator *)&mat);
          pXVar4 = get_element(xml,&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          node.instance = (Instance *)polymesh;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001128e0;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar5 == (char *)0x0) goto LAB_00112c79;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          std::__cxx11::string::string((string *)&mat,pcVar5 + 1,(allocator *)&s);
          std::__cxx11::string::string((string *)&local_3e8,(string *)&mat);
          pXVar4 = uri_find(&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_00112c79;
          pMVar6 = (MaterialInfo *)operator_new(0x50);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar6->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pMVar6->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(pMVar6->super_Instance).name._M_string_length = ZEXT1632(auVar8);
          (pMVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).id.field_2;
          (pMVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).name.field_2;
          (pMVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar6);
          (polymesh->vertices).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar6;
        }
        else {
          polymesh = (PolymeshInfo *)operator_new(0xb0);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&polymesh->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(polymesh->super_Instance).id.field_2 + 8) =
               ZEXT1632(auVar8);
          auVar9 = ZEXT1632(auVar8);
          polymesh->normals = (vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>)auVar9._0_24_;
          (polymesh->texcoords).super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._24_8_;
          *(undefined1 (*) [32])((long)&(polymesh->super_Instance).name.field_2 + 8) = auVar9;
          *(undefined1 (*) [32])
           &(polymesh->texcoords).super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
            _M_impl.super__Vector_impl_data._M_finish = auVar9;
          polymesh->polygons =
               (vector<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>)auVar9._0_24_;
          polymesh->material = (MaterialInfo *)auVar9._24_8_;
          (polymesh->super_Instance).id._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).id.field_2;
          (polymesh->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (polymesh->super_Instance).name._M_dataplus._M_p =
               (pointer)&(polymesh->super_Instance).name.field_2;
          (polymesh->super_Instance).name.field_2._M_local_buf[0] = '\0';
          auVar9 = ZEXT1632(auVar8);
          polymesh->vertices = (vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>)auVar9._0_24_;
          (polymesh->normals).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._24_8_;
          *(undefined1 (*) [32])
           &(polymesh->normals).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
            _M_impl.super__Vector_impl_data._M_finish = auVar9;
          *(undefined1 (*) [32])
           &(polymesh->texcoords).super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = auVar9;
          parse_polymesh(xml_01,polymesh);
          std::__cxx11::string::string
                    ((string *)&local_368,
                     "instance_geometry/bind_material/technique_common/instance_material",
                     (allocator *)&mat);
          pXVar4 = get_element(xml,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          node.instance = (Instance *)polymesh;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001128e0;
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar5 == (char *)0x0) {
LAB_00112c79:
            exit(1);
          }
          pcVar5 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          std::__cxx11::string::string((string *)&mat,pcVar5 + 1,(allocator *)&s);
          std::__cxx11::string::string((string *)&local_388,(string *)&mat);
          pXVar4 = uri_find(&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          if (pXVar4 == (XMLElement *)0x0) goto LAB_00112c79;
          pMVar6 = (MaterialInfo *)operator_new(0x50);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar6->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pMVar6->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(pMVar6->super_Instance).name._M_string_length = ZEXT1632(auVar8);
          (pMVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).id.field_2;
          (pMVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar6->super_Instance).name.field_2;
          (pMVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar6);
          polymesh->material = pMVar6;
        }
        std::__cxx11::string::~string((string *)&mat);
        node.instance = &polymesh->super_Instance;
      }
    }
    else {
      this_00 = (LightInfo *)operator_new(0xf0);
      LightInfo::LightInfo(this_00);
      parse_light(xml_00,this_00);
      node.instance = (Instance *)this_00;
    }
  }
  else {
    this = (CameraInfo *)operator_new(0xa0);
    auVar8 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)&(this->up_dir).field_0 + 0x10) = ZEXT1632(auVar8);
    *(undefined1 (*) [32])((long)&(this->view_dir).field_0 + 0x10) = ZEXT1632(auVar8);
    auVar9 = ZEXT1632(auVar8);
    *(undefined1 (*) [32])((long)&(this->super_Instance).name.field_2 + 8) = auVar9;
    *(undefined1 (*) [32])((long)&(this->super_Instance).id.field_2 + 8) = auVar9;
    *(undefined1 (*) [32])&this->super_Instance = auVar9;
    CameraInfo::CameraInfo(this);
    parse_camera(pXVar4,this);
    node.instance = (Instance *)this;
  }
LAB_001128e0:
  std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::push_back(scene,&node);
  Node::~Node(&node);
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

  // create new node
  Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {

      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {

      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;

    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}